

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O0

void __thiscall
slang::syntax::MacroFormalArgumentListSyntax::MacroFormalArgumentListSyntax
          (MacroFormalArgumentListSyntax *this,Token openParen,
          SeparatedSyntaxList<slang::syntax::MacroFormalArgumentSyntax> *args,Token closeParen)

{
  bool bVar1;
  MacroFormalArgumentSyntax *pMVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  MacroFormalArgumentSyntax *child;
  iterator __end2;
  iterator __begin2;
  SeparatedSyntaxList<slang::syntax::MacroFormalArgumentSyntax> *__range2;
  SeparatedSyntaxList<slang::syntax::MacroFormalArgumentSyntax> *args_local;
  MacroFormalArgumentListSyntax *this_local;
  Token closeParen_local;
  Token openParen_local;
  
  uVar4 = closeParen._0_8_;
  uVar3 = openParen._0_8_;
  SyntaxNode::SyntaxNode(&this->super_SyntaxNode,MacroFormalArgumentList);
  (this->openParen).kind = (short)uVar3;
  (this->openParen).field_0x2 = (char)((ulong)uVar3 >> 0x10);
  (this->openParen).numFlags = (NumericTokenFlags)(char)((ulong)uVar3 >> 0x18);
  (this->openParen).rawLen = (int)((ulong)uVar3 >> 0x20);
  (this->openParen).info = openParen.info;
  SeparatedSyntaxList<slang::syntax::MacroFormalArgumentSyntax>::SeparatedSyntaxList
            (&this->args,args);
  (this->closeParen).kind = (short)uVar4;
  (this->closeParen).field_0x2 = (char)((ulong)uVar4 >> 0x10);
  (this->closeParen).numFlags = (NumericTokenFlags)(char)((ulong)uVar4 >> 0x18);
  (this->closeParen).rawLen = (int)((ulong)uVar4 >> 0x20);
  (this->closeParen).info = closeParen.info;
  (this->args).super_SyntaxListBase.super_SyntaxNode.parent = &this->super_SyntaxNode;
  join_0x00000010_0x00000000_ =
       SeparatedSyntaxList<slang::syntax::MacroFormalArgumentSyntax>::begin(&this->args);
  _child = SeparatedSyntaxList<slang::syntax::MacroFormalArgumentSyntax>::end(&this->args);
  while( true ) {
    bVar1 = iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::MacroFormalArgumentSyntax>::iterator_base<slang::syntax::MacroFormalArgumentSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::MacroFormalArgumentSyntax_*,_unsigned_long,_slang::syntax::MacroFormalArgumentSyntax_**,_slang::syntax::MacroFormalArgumentSyntax_*&>
            ::operator!=((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::MacroFormalArgumentSyntax>::iterator_base<slang::syntax::MacroFormalArgumentSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::MacroFormalArgumentSyntax_*,_unsigned_long,_slang::syntax::MacroFormalArgumentSyntax_**,_slang::syntax::MacroFormalArgumentSyntax_*&>
                          *)&__end2.index,
                         (iterator_base<slang::syntax::MacroFormalArgumentSyntax_*> *)&child);
    if (!bVar1) break;
    pMVar2 = SeparatedSyntaxList<slang::syntax::MacroFormalArgumentSyntax>::
             iterator_base<slang::syntax::MacroFormalArgumentSyntax_*>::operator*
                       ((iterator_base<slang::syntax::MacroFormalArgumentSyntax_*> *)&__end2.index);
    (pMVar2->super_SyntaxNode).parent = &this->super_SyntaxNode;
    iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::MacroFormalArgumentSyntax>::iterator_base<slang::syntax::MacroFormalArgumentSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::MacroFormalArgumentSyntax_*,_unsigned_long,_slang::syntax::MacroFormalArgumentSyntax_**,_slang::syntax::MacroFormalArgumentSyntax_*&>
    ::operator++((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::MacroFormalArgumentSyntax>::iterator_base<slang::syntax::MacroFormalArgumentSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::MacroFormalArgumentSyntax_*,_unsigned_long,_slang::syntax::MacroFormalArgumentSyntax_**,_slang::syntax::MacroFormalArgumentSyntax_*&>
                  *)&__end2.index);
  }
  return;
}

Assistant:

MacroFormalArgumentListSyntax(Token openParen, const SeparatedSyntaxList<MacroFormalArgumentSyntax>& args, Token closeParen) :
        SyntaxNode(SyntaxKind::MacroFormalArgumentList), openParen(openParen), args(args), closeParen(closeParen) {
        this->args.parent = this;
        for (auto child : this->args)
            child->parent = this;
    }